

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

void Abc_FrameUpdateGia(Abc_Frame_t *pAbc,Gia_Man_t *pNew)

{
  Vec_Ptr_t *pVVar1;
  Gia_Man_t *pGVar2;
  
  if (pNew != (Gia_Man_t *)0x0) {
    if (pNew->vCos->nSize == pNew->nRegs) {
      Abc_Print(0,"The current GIA has no primary outputs. Some commands may not work correctly.\n")
      ;
    }
    pGVar2 = pAbc->pGia;
    if (pGVar2 != pNew) {
      if ((((pGVar2 != (Gia_Man_t *)0x0) && (pNew->vNamesIn == (Vec_Ptr_t *)0x0)) &&
          (pVVar1 = pGVar2->vNamesIn, pVVar1 != (Vec_Ptr_t *)0x0)) &&
         (pNew->vCis->nSize == pVVar1->nSize)) {
        pNew->vNamesIn = pVVar1;
        pGVar2->vNamesIn = (Vec_Ptr_t *)0x0;
      }
      if (((pGVar2 != (Gia_Man_t *)0x0) && (pNew->vNamesOut == (Vec_Ptr_t *)0x0)) &&
         ((pVVar1 = pGVar2->vNamesOut, pVVar1 != (Vec_Ptr_t *)0x0 &&
          (pNew->vCos->nSize == pVVar1->nSize)))) {
        pNew->vNamesOut = pVVar1;
        pGVar2->vNamesOut = (Vec_Ptr_t *)0x0;
      }
      if (pAbc->pGia2 != (Gia_Man_t *)0x0) {
        Gia_ManStop(pAbc->pGia2);
        pGVar2 = pAbc->pGia;
      }
      pAbc->pGia2 = pGVar2;
      pAbc->pGia = pNew;
    }
    return;
  }
  Abc_Print(-1,"Abc_FrameUpdateGia(): Tranformation has failed.\n");
  return;
}

Assistant:

void Abc_FrameUpdateGia( Abc_Frame_t * pAbc, Gia_Man_t * pNew )
{
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_FrameUpdateGia(): Tranformation has failed.\n" );
        return;
    }
    if ( Gia_ManPoNum(pNew) == 0 )
        Abc_Print( 0, "The current GIA has no primary outputs. Some commands may not work correctly.\n" );
    if ( pNew == pAbc->pGia )
        return;
    // transfer names
    if (!pNew->vNamesIn && pAbc->pGia && pAbc->pGia->vNamesIn && Gia_ManCiNum(pNew) == Vec_PtrSize(pAbc->pGia->vNamesIn))
    {
        pNew->vNamesIn = pAbc->pGia->vNamesIn;
        pAbc->pGia->vNamesIn = NULL;
    }
    if (!pNew->vNamesOut && pAbc->pGia && pAbc->pGia->vNamesOut && Gia_ManCoNum(pNew) == Vec_PtrSize(pAbc->pGia->vNamesOut))
    {
        pNew->vNamesOut = pAbc->pGia->vNamesOut;
        pAbc->pGia->vNamesOut = NULL;
    }
    // update
    if ( pAbc->pGia2 )
        Gia_ManStop( pAbc->pGia2 );
    pAbc->pGia2 = pAbc->pGia;
    pAbc->pGia  = pNew;
}